

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

void __thiscall Fl_Menu_Item::setonly(Fl_Menu_Item *this)

{
  int iVar1;
  Fl_Menu_Item *local_18;
  Fl_Menu_Item *j;
  Fl_Menu_Item *this_local;
  
  this->flags = this->flags | 0xc;
  local_18 = this;
  while ((((local_18->flags & 0x80U) == 0 &&
          (local_18 = local_18 + 1, local_18->text != (char *)0x0)) &&
         (iVar1 = radio(local_18), iVar1 != 0))) {
    clear(local_18);
  }
  local_18 = this + -1;
  while (((local_18->text != (char *)0x0 && ((local_18->flags & 0x80U) == 0)) &&
         (iVar1 = radio(local_18), iVar1 != 0))) {
    clear(local_18);
    local_18 = local_18 + -1;
  }
  return;
}

Assistant:

void Fl_Menu_Item::setonly() {
  flags |= FL_MENU_RADIO | FL_MENU_VALUE;
  Fl_Menu_Item* j;
  for (j = this; ; ) {	// go down
    if (j->flags & FL_MENU_DIVIDER) break; // stop on divider lines
    j++;
    if (!j->text || !j->radio()) break; // stop after group
    j->clear();
  }
  for (j = this-1; ; j--) { // go up
    if (!j->text || (j->flags&FL_MENU_DIVIDER) || !j->radio()) break;
    j->clear();
  }
}